

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importPBRT.cpp
# Opt level: O0

SP pbrt::importPBRT(string *fileName,string *basePath)

{
  bool bVar1;
  runtime_error *this;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar4;
  shared_ptr<pbrt::syntactic::Camera> cam;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *__range1;
  SP pbrt;
  SP *scene;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *in_stack_fffffffffffffc98;
  SemanticParser *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  local_2b0;
  __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
  local_298;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *local_290;
  SP *in_stack_fffffffffffffd98;
  SP *in_stack_fffffffffffffda0;
  SP *in_stack_fffffffffffffda8;
  SemanticParser *in_stack_fffffffffffffdb0;
  SP *in_stack_fffffffffffffe18;
  SP *in_stack_fffffffffffffe20;
  SP *in_stack_fffffffffffffe88;
  SP *in_stack_fffffffffffffe90;
  SP *in_stack_fffffffffffffed8;
  SP *in_stack_fffffffffffffee0;
  string local_90 [71];
  allocator local_49;
  string local_48 [64];
  element_type *camera;
  
  camera = in_RDI;
  std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Scene> *)0x24384c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,".pbrt",&local_49);
  bVar1 = endsWith(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    syntactic::Scene::parse(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::shared_ptr<pbrt::syntactic::Scene>::operator=
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243912);
    std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    SemanticParser::SemanticParser(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::shared_ptr<pbrt::Scene>::shared_ptr
              (&in_stack_fffffffffffffca0->result,
               (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc98);
    SemanticParser::~SemanticParser(in_stack_fffffffffffffca0);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243ade);
    std::shared_ptr<pbrt::Scene>::shared_ptr
              (&in_stack_fffffffffffffca0->result,
               (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc98);
    std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    createFilm(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243b2d);
    std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x243b3a);
    std::shared_ptr<pbrt::Scene>::shared_ptr
              (&in_stack_fffffffffffffca0->result,
               (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc98);
    std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    createSampler(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243b89);
    std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x243b96);
    std::shared_ptr<pbrt::Scene>::shared_ptr
              (&in_stack_fffffffffffffca0->result,
               (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc98);
    std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    createIntegrator(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243be5);
    std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x243bf2);
    std::shared_ptr<pbrt::Scene>::shared_ptr
              (&in_stack_fffffffffffffca0->result,
               (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffc98);
    std::shared_ptr<pbrt::syntactic::Scene>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffca0,
               (shared_ptr<pbrt::syntactic::Scene> *)in_stack_fffffffffffffc98);
    createPixelFilter(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243c41);
    std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x243c4e);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x243c5b);
    local_290 = &peVar2->cameras;
    local_298._M_current =
         (shared_ptr<pbrt::syntactic::Camera> *)
         std::
         vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
         ::begin(in_stack_fffffffffffffc98);
    local_2b0.
    super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                  ::end(in_stack_fffffffffffffc98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
                               *)in_stack_fffffffffffffca0,
                              (__normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
                               *)in_stack_fffffffffffffc98), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
      ::operator*(&local_298);
      in_stack_fffffffffffffc98 = &local_2b0;
      std::shared_ptr<pbrt::syntactic::Camera>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffca0,
                 (shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffc98);
      peVar3 = std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x243cda);
      in_stack_fffffffffffffca0 = (SemanticParser *)&peVar3->cameras;
      std::shared_ptr<pbrt::syntactic::Camera>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffca0,
                 (shared_ptr<pbrt::syntactic::Camera> *)in_stack_fffffffffffffc98);
      createCamera((SP *)camera);
      std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
      push_back((vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 *)in_stack_fffffffffffffca0,(value_type *)in_stack_fffffffffffffc98);
      std::shared_ptr<pbrt::Camera>::~shared_ptr((shared_ptr<pbrt::Camera> *)0x243d2e);
      std::shared_ptr<pbrt::syntactic::Camera>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)0x243d3b);
      std::shared_ptr<pbrt::syntactic::Camera>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Camera> *)0x243d48);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::syntactic::Camera>_*,_std::vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>_>
      ::operator++(&local_298);
    }
    std::shared_ptr<pbrt::syntactic::Scene>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Scene> *)0x243ec8);
    SVar4.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    SVar4.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (SP)SVar4.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
  std::runtime_error::runtime_error(this,local_90);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Scene::SP importPBRT(const std::string &fileName, const std::string &basePath)
  {
    pbrt::syntactic::Scene::SP pbrt;
    if (endsWith(fileName,".pbrt"))
      pbrt = pbrt::syntactic::Scene::parse(fileName, basePath);
    else
      throw std::runtime_error("could not detect input file format!? (unknown extension in '"+fileName+"')");
      
    Scene::SP scene = SemanticParser(pbrt).result;
    createFilm(scene,pbrt);
    createSampler(scene,pbrt);
    createIntegrator(scene,pbrt);
    createPixelFilter(scene,pbrt);
    for (auto cam : pbrt->cameras)
      scene->cameras.push_back(createCamera(cam));
    return scene;
  }